

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O2

void init_driver(audit_regressor_data *dat)

{
  options_i *poVar1;
  uint *puVar2;
  _func_int *p_Var3;
  int iVar4;
  int iVar5;
  typed_option<unsigned_int> *ptVar6;
  ostream *poVar7;
  vw_exception *pvVar8;
  vw *pvVar9;
  byte bVar10;
  ulong uVar11;
  allocator local_23b;
  allocator local_23a;
  allocator local_239;
  string local_238 [32];
  string local_218 [32];
  string local_1f8;
  string local_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  poVar1 = dat->all->options;
  std::__cxx11::string::string((string *)&__msg,"cache_file",&local_239);
  iVar4 = (*poVar1->_vptr_options_i[1])(poVar1,&__msg);
  if ((char)iVar4 == '\0') {
    poVar1 = dat->all->options;
    std::__cxx11::string::string(local_218,"cache",&local_23a);
    iVar5 = (*poVar1->_vptr_options_i[1])(poVar1,local_218);
    if ((char)iVar5 != '\0') goto LAB_001cd74a;
    bVar10 = 0;
  }
  else {
LAB_001cd74a:
    poVar1 = dat->all->options;
    std::__cxx11::string::string(local_238,"kill_cache",&local_23b);
    iVar5 = (*poVar1->_vptr_options_i[1])(poVar1,local_238);
    bVar10 = (byte)iVar5 ^ 1;
    std::__cxx11::string::~string(local_238);
    if ((char)iVar4 != '\0') goto LAB_001cd79d;
  }
  std::__cxx11::string::~string(local_218);
LAB_001cd79d:
  std::__cxx11::string::~string((string *)&__msg);
  if (bVar10 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,
                    "audit_regressor is incompatible with a cache file.  Use it in single pass mode only."
                   );
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xcf,&local_1d8);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dat->all->sd->dump_interval = 1.0;
  dat->all->sd->example_number = 0;
  pvVar9 = dat->all;
  dat->increment = *(ulong *)(pvVar9->l + 0xe0) / *(ulong *)(pvVar9->l + 0xd8);
  dat->total_class_cnt = *(size_t *)(pvVar9->l + 0xd8);
  poVar1 = pvVar9->options;
  std::__cxx11::string::string((string *)&__msg,"csoaa",(allocator *)local_238);
  iVar4 = (*poVar1->_vptr_options_i[1])(poVar1,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  pvVar9 = dat->all;
  if ((char)iVar4 != '\0') {
    poVar1 = pvVar9->options;
    std::__cxx11::string::string((string *)&__msg,"csoaa",(allocator *)local_238);
    ptVar6 = VW::config::options_i::get_typed_option<unsigned_int>(poVar1,(string *)&__msg);
    puVar2 = (ptVar6->m_value).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (puVar2 == (uint *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = (ulong)*puVar2;
    }
    std::__cxx11::string::~string((string *)&__msg);
    pvVar9 = dat->all;
    if (dat->total_class_cnt != uVar11) {
      dat->total_class_cnt = uVar11;
      dat->increment = *(ulong *)(pvVar9->l + 0xe0) / uVar11;
    }
  }
  if ((pvVar9->weights).sparse == true) {
    regressor_values<sparse_parameters>(dat,&(pvVar9->weights).sparse_weights);
  }
  else {
    regressor_values<dense_parameters>(dat,&(pvVar9->weights).dense_weights);
  }
  if (dat->loaded_regressor_values == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<(&local_1a8,"regressor has no non-zero weights. Nothing to audit.");
    pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/audit_regressor.cc"
               ,0xe9,&local_1f8);
    __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  if (dat->all->quiet == false) {
    poVar7 = std::operator<<(&(dat->all->trace_message).super_ostream,"Regressor contains ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7," values\n");
    pvVar9 = dat->all;
    p_Var3 = (pvVar9->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var3 + 0x18 + (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var3 + 0x18 + (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    *(undefined8 *)
     ((pvVar9->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    poVar7 = std::operator<<(&(pvVar9->trace_message).super_ostream,"example");
    poVar7 = std::operator<<(poVar7," ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 0xe;
    poVar7 = std::operator<<(poVar7,"values");
    poVar7 = std::operator<<(poVar7," ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 8;
    poVar7 = std::operator<<(poVar7,"total");
    std::endl<char,std::char_traits<char>>(poVar7);
    pvVar9 = dat->all;
    p_Var3 = (pvVar9->trace_message).super_ostream._vptr_basic_ostream[-3];
    *(uint *)(p_Var3 + 0x18 + (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream) =
         *(uint *)(p_Var3 + 0x18 + (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream)
         & 0xffffff4f | 0x20;
    *(undefined8 *)
     ((pvVar9->trace_message).super_ostream._vptr_basic_ostream[-3] + 0x10 +
     (long)&(pvVar9->trace_message).super_ostream._vptr_basic_ostream) = 0xc;
    poVar7 = std::operator<<(&(pvVar9->trace_message).super_ostream,"counter");
    poVar7 = std::operator<<(poVar7," ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 0xe;
    poVar7 = std::operator<<(poVar7,"audited");
    poVar7 = std::operator<<(poVar7," ");
    *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 8;
    poVar7 = std::operator<<(poVar7,"progress");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  return;
}

Assistant:

void init_driver(audit_regressor_data& dat)
{
  // checks a few settings that might be applied after audit_regressor_setup() is called
  if ((dat.all->options->was_supplied("cache_file") || dat.all->options->was_supplied("cache")) &&
      !dat.all->options->was_supplied("kill_cache"))
  {
    THROW("audit_regressor is incompatible with a cache file.  Use it in single pass mode only.");
  }

  dat.all->sd->dump_interval = 1.;  // regressor could initialize these if saved with --save_resume
  dat.all->sd->example_number = 0;

  dat.increment = dat.all->l->increment / dat.all->l->weights;
  dat.total_class_cnt = dat.all->l->weights;

  if (dat.all->options->was_supplied("csoaa"))
  {
    size_t n = dat.all->options->get_typed_option<uint32_t>("csoaa").value();
    if (n != dat.total_class_cnt)
    {
      dat.total_class_cnt = n;
      dat.increment = dat.all->l->increment / n;
    }
  }

  // count non-null feature values in regressor
  if (dat.all->weights.sparse)
    regressor_values(dat, dat.all->weights.sparse_weights);
  else
    regressor_values(dat, dat.all->weights.dense_weights);

  if (dat.loaded_regressor_values == 0)
    THROW("regressor has no non-zero weights. Nothing to audit.");

  if (!dat.all->quiet)
  {
    dat.all->trace_message << "Regressor contains " << dat.loaded_regressor_values << " values\n";
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "example"
                           << " " << std::setw(shared_data::col_example_weight) << "values"
                           << " " << std::setw(shared_data::col_current_label) << "total" << std::endl;
    dat.all->trace_message << std::left << std::setw(shared_data::col_example_counter) << "counter"
                           << " " << std::setw(shared_data::col_example_weight) << "audited"
                           << " " << std::setw(shared_data::col_current_label) << "progress" << std::endl;
  }
}